

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_clone.c
# Opt level: O3

_glist * clone_makeone(t_symbol *s,int argc,t_atom *argv)

{
  _glist *p_Var1;
  
  pd_maininstance.pd_newest = (t_pd *)0x0;
  pd_typedmess(&pd_objectmaker,s,argc,argv);
  p_Var1 = (_glist *)pd_maininstance.pd_newest;
  if (pd_maininstance.pd_newest == (t_pd *)0x0) {
    p_Var1 = (_glist *)0x0;
    pd_error((void *)0x0,"clone: can\'t create subpatch \'%s\'",s->s_name);
  }
  else if (*pd_maininstance.pd_newest == canvas_class) {
    pd_maininstance.pd_newest = (t_pd *)0x0;
    *(byte *)((long)p_Var1 + 0xe9) = *(byte *)((long)p_Var1 + 0xe9) | 8;
  }
  else {
    p_Var1 = (_glist *)0x0;
    pd_error((void *)0x0,"clone: can\'t clone \'%s\' because it\'s not an abstraction",s->s_name);
    pd_free(pd_maininstance.pd_newest);
    pd_maininstance.pd_newest = (t_pd *)0x0;
  }
  return p_Var1;
}

Assistant:

static t_canvas *clone_makeone(t_symbol *s, int argc, t_atom *argv)
{
    t_canvas *retval;
    pd_this->pd_newest = 0;
    typedmess(&pd_objectmaker, s, argc, argv);
    if (pd_this->pd_newest == 0)
    {
        pd_error(0, "clone: can't create subpatch '%s'",
            s->s_name);
        return (0);
    }
    if (*pd_this->pd_newest != canvas_class)
    {
        pd_error(0, "clone: can't clone '%s' because it's not an abstraction",
            s->s_name);
        pd_free(pd_this->pd_newest);
        pd_this->pd_newest = 0;
        return (0);
    }
    retval = (t_canvas *)pd_this->pd_newest;
    pd_this->pd_newest = 0;
    retval->gl_isclone = 1;
    return (retval);
}